

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int Curl_conncache_init(conncache *connc,int size)

{
  CURL_conflict *pCVar1;
  bool bVar2;
  int size_local;
  conncache *connc_local;
  
  pCVar1 = curl_easy_init();
  connc->closure_handle = pCVar1;
  bVar2 = connc->closure_handle != (Curl_easy *)0x0;
  if (bVar2) {
    *(uint *)&(connc->closure_handle->state).field_0x74c =
         *(uint *)&(connc->closure_handle->state).field_0x74c & 0xffdfffff | 0x200000;
    Curl_hash_init(&connc->hash,size,Curl_hash_str,Curl_str_key_compare,free_bundle_hash_entry);
    (connc->closure_handle->state).conn_cache = connc;
  }
  connc_local._4_4_ = (uint)!bVar2;
  return connc_local._4_4_;
}

Assistant:

int Curl_conncache_init(struct conncache *connc, int size)
{
  /* allocate a new easy handle to use when closing cached connections */
  connc->closure_handle = curl_easy_init();
  if(!connc->closure_handle)
    return 1; /* bad */
  connc->closure_handle->state.internal = true;

  Curl_hash_init(&connc->hash, size, Curl_hash_str,
                 Curl_str_key_compare, free_bundle_hash_entry);
  connc->closure_handle->state.conn_cache = connc;

  return 0; /* good */
}